

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O0

void __thiscall Assimp::D3DS::Node::~Node(Node *this)

{
  Node *this_00;
  size_type sVar1;
  reference ppNVar2;
  uint local_14;
  uint i;
  Node *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::size
                      (&this->mChildren);
    if (sVar1 <= local_14) break;
    ppNVar2 = std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::operator[]
                        (&this->mChildren,(ulong)local_14);
    this_00 = *ppNVar2;
    if (this_00 != (Node *)0x0) {
      ~Node(this_00);
      operator_delete(this_00);
    }
    local_14 = local_14 + 1;
  }
  std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::~vector
            (&this->aCameraRollKeys);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::~vector(&this->aTargetPositionKeys);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::~vector(&this->aScalingKeys);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::~vector(&this->aPositionKeys);
  std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::~vector(&this->aRotationKeys);
  std::__cxx11::string::~string((string *)&this->mDummyName);
  std::__cxx11::string::~string((string *)&this->mName);
  std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::~vector
            (&this->mChildren);
  return;
}

Assistant:

~Node()
    {
        for (unsigned int i = 0; i < mChildren.size();++i)
            delete mChildren[i];
    }